

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int properties_set_to(PROPERTIES_HANDLE properties,AMQP_VALUE to_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE to_amqp_value;
  PROPERTIES_INSTANCE *properties_instance;
  int result;
  AMQP_VALUE to_value_local;
  PROPERTIES_HANDLE properties_local;
  
  if (properties == (PROPERTIES_HANDLE)0x0) {
    properties_instance._4_4_ = 0x3f6e;
  }
  else {
    if (to_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(to_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      properties_instance._4_4_ = 0x3f7e;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(properties->composite_value,2,local_30);
      if (iVar1 == 0) {
        properties_instance._4_4_ = 0;
      }
      else {
        properties_instance._4_4_ = 0x3f84;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return properties_instance._4_4_;
}

Assistant:

int properties_set_to(PROPERTIES_HANDLE properties, AMQP_VALUE to_value)
{
    int result;

    if (properties == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        PROPERTIES_INSTANCE* properties_instance = (PROPERTIES_INSTANCE*)properties;
        AMQP_VALUE to_amqp_value;
        if (to_value == NULL)
        {
            to_amqp_value = NULL;
        }
        else
        {
            to_amqp_value = amqpvalue_clone(to_value);
        }
        if (to_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(properties_instance->composite_value, 2, to_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(to_amqp_value);
        }
    }

    return result;
}